

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void GenerateOutputControlFontFamily(utf16 *pchFontName,utf16 *pchOutputName)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  long lVar6;
  size_t sVar7;
  long lVar8;
  undefined1 auVar9 [16];
  wstring stu;
  wchar_t rgchw [120];
  long *local_228;
  long local_220;
  long local_218 [2];
  wchar_t local_208 [122];
  
  lVar6 = 0;
  do {
    uVar1 = *(ulong *)(pchFontName + lVar6);
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar1;
    auVar2._12_2_ = (short)(uVar1 >> 0x30);
    auVar3._8_2_ = (short)(uVar1 >> 0x20);
    auVar3._0_8_ = uVar1;
    auVar3._10_4_ = auVar2._10_4_;
    auVar5._6_8_ = 0;
    auVar5._0_6_ = auVar3._8_6_;
    auVar4._4_2_ = (short)(uVar1 >> 0x10);
    auVar4._0_4_ = (uint)uVar1;
    auVar4._6_8_ = SUB148(auVar5 << 0x40,6);
    auVar9._0_4_ = (uint)uVar1 & 0xffff;
    auVar9._4_10_ = auVar4._4_10_;
    auVar9._14_2_ = 0;
    *(undefined1 (*) [16])(local_208 + lVar6) = auVar9;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x78);
  local_228 = local_218;
  sVar7 = wcslen(local_208);
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_228,local_208,local_208 + sVar7);
  std::__cxx11::wstring::append((wchar_t *)&local_228);
  lVar6 = local_220 * 4 + 4 >> 2;
  if (0 < lVar6) {
    lVar6 = lVar6 + 1;
    lVar8 = 0;
    do {
      *(undefined2 *)((long)pchOutputName + lVar8) = *(undefined2 *)((long)local_228 + lVar8 * 2);
      lVar6 = lVar6 + -1;
      lVar8 = lVar8 + 2;
    } while (1 < lVar6);
  }
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] * 4 + 4);
  }
  return;
}

Assistant:

void GenerateOutputControlFontFamily(utf16 * pchFontName, utf16 * pchOutputName)
{
	wchar_t rgchw[120];
	std::copy(pchFontName, pchFontName + 120, rgchw);
	std::wstring stu(rgchw);
	stu.append(L" Graphite");
	std::copy(stu.data(), stu.data() + stu.length() + 1, pchOutputName);
	//utf16cpy(pchOutputName, (const utf16*)stu.Chars());
	//pchOutputName[stu.Length() + 1] = 0;
}